

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void dfg_stone_close_handler(CManager cm,CMConnection conn,int stone,void *client_data)

{
  uint uVar1;
  _event_path_data *p_Var2;
  lookup_table_elem *plVar3;
  FILE *pFVar4;
  int iVar5;
  __pid_t _Var6;
  CMFormat format;
  ulong uVar7;
  pthread_t pVar8;
  ulong uVar9;
  EVconn_shutdown_msg msg;
  undefined4 uStack_34;
  long local_30;
  
  p_Var2 = cm->evp;
  format = INT_CMlookup_format(*client_data,EVdfg_conn_shutdown_format_list);
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                   ,0x47c);
  INT_EVfreeze_stone(cm,stone);
  uVar1 = p_Var2->stone_lookup_table_size;
  uVar9 = 0;
  uVar7 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar7 = uVar9;
  }
  iVar5 = -1;
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    plVar3 = p_Var2->stone_lookup_table;
    if (plVar3[uVar9].local_id == stone) {
      iVar5 = plVar3[uVar9].global_id;
    }
  }
  if (iVar5 == -1) {
    iVar5 = CMtrace_val[0xd];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar5 = CMtrace_init(cm,EVdfgVerbose);
    }
    if (iVar5 != 0) {
      if (CMtrace_PID != 0) {
        pFVar4 = (FILE *)cm->CMTrace_file;
        _Var6 = getpid();
        pVar8 = pthread_self();
        fprintf(pFVar4,"P%lxT%lx - ",(long)_Var6,pVar8);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&msg);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",CONCAT44(uStack_34,msg.stone),local_30);
      }
      fprintf((FILE *)cm->CMTrace_file,
              "Bad mojo, failed to find global stone id after stone close of stone %d\n",
              (ulong)(uint)stone);
    }
    fflush((FILE *)cm->CMTrace_file);
    iVar5 = CMtrace_val[0xd];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar5 = CMtrace_init(cm,EVdfgVerbose);
    }
    if (iVar5 != 0) {
      if (CMtrace_PID != 0) {
        pFVar4 = (FILE *)cm->CMTrace_file;
        _Var6 = getpid();
        pVar8 = pthread_self();
        fprintf(pFVar4,"P%lxT%lx - ",(long)_Var6,pVar8);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&msg);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",CONCAT44(uStack_34,msg.stone),local_30);
      }
      fwrite("  If the above message occurs during shutdown, this is likely not a concern\n",0x4c,1,
             (FILE *)cm->CMTrace_file);
    }
    fflush((FILE *)cm->CMTrace_file);
    iVar5 = 0x489;
  }
  else {
    msg.stone = iVar5;
    if (*(CMConnection *)((long)client_data + 0x20) == (CMConnection)0x0) {
      queue_master_msg(*(EVmaster *)((long)client_data + 0x28),&msg,DFGconn_shutdown,
                       (CMConnection)0x0,0);
    }
    else {
      INT_CMwrite(*(CMConnection *)((long)client_data + 0x20),format,&msg);
    }
    cm = *client_data;
    iVar5 = 0x492;
  }
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,iVar5);
  return;
}

Assistant:

static void
dfg_stone_close_handler(CManager cm, CMConnection conn, int stone, 
		  void *client_data)
{
    EVclient client = (EVclient)client_data;
    event_path_data evp = cm->evp;
    int global_stone_id = -1;
    CMFormat conn_shutdown_msg = INT_CMlookup_format(client->cm, EVdfg_conn_shutdown_format_list);
    EVconn_shutdown_msg msg;
    (void)cm;
    (void)conn;
    CManager_lock(cm);
    /* first, freeze the stone so that we don't lose any more data */
    INT_EVfreeze_stone(cm, stone);

    int i;
    for (i=0; i < evp->stone_lookup_table_size; i++ ) {
	if (stone == evp->stone_lookup_table[i].local_id) {
	    global_stone_id = evp->stone_lookup_table[i].global_id;
	}
    }
    if (global_stone_id == -1) {
	CMtrace_out(cm, EVdfgVerbose, "Bad mojo, failed to find global stone id after stone close of stone %d\n", stone);
	CMtrace_out(cm, EVdfgVerbose, "  If the above message occurs during shutdown, this is likely not a concern\n");
	CManager_unlock(cm);
	return;
    }
    msg.stone = global_stone_id;
    if (client->master_connection != NULL) {
	INT_CMwrite(client->master_connection, conn_shutdown_msg, &msg);
    } else {
	queue_master_msg(client->master, (void*)&msg, DFGconn_shutdown, NULL, /*copy*/0);
    }
    CManager_unlock(client->cm);
}